

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

void generate_instances_for_node
               (_vox_array<const__vox_scene_node__*> *stack,_vox_array<_vox_scene_node_> *nodes,
               uint32_t node_index,_vox_array<unsigned_int> *child_id_array,
               _vox_array<ogt_vox_model_*> *model_ptrs,_vox_array<ogt_vox_instance> *instances,
               _vox_suballoc_array *misc_data,_vox_array<ogt_vox_group> *groups,uint32_t group_index
               ,bool generate_keyframes)

{
  _vox_scene_node_type _Var1;
  uint uVar2;
  _vox_scene_node_ *p_Var3;
  char *str;
  uint *puVar4;
  size_t sVar5;
  ogt_vox_model **ppoVar6;
  _vox_scene_node_ **pp_Var7;
  anon_union_352_3_5477816a_for_u *str_00;
  char *transform_last_name_1;
  ogt_vox_instance new_instance;
  _vox_scene_node_ *last_group;
  _vox_scene_node_ *last_transform_1;
  uint32_t i;
  uint32_t *child_node_ids;
  char *transform_last_name;
  ogt_vox_group group;
  _vox_scene_node_ *last_transform;
  _vox_scene_node_ *p_Stack_50;
  uint32_t next_group_index;
  _vox_scene_node_ *node;
  _vox_array<ogt_vox_instance> *p_Stack_40;
  bool generate_keyframes_local;
  _vox_array<ogt_vox_instance> *instances_local;
  _vox_array<ogt_vox_model_*> *model_ptrs_local;
  _vox_array<unsigned_int> *child_id_array_local;
  _vox_array<_vox_scene_node_> *p_Stack_20;
  uint32_t node_index_local;
  _vox_array<_vox_scene_node_> *nodes_local;
  _vox_array<const__vox_scene_node__*> *stack_local;
  
  node._7_1_ = generate_keyframes;
  p_Stack_40 = instances;
  instances_local = (_vox_array<ogt_vox_instance> *)model_ptrs;
  model_ptrs_local = (_vox_array<ogt_vox_model_*> *)child_id_array;
  child_id_array_local._4_4_ = node_index;
  p_Stack_20 = nodes;
  nodes_local = (_vox_array<_vox_scene_node_> *)stack;
  p_Stack_50 = _vox_array<_vox_scene_node_>::operator[](nodes,(ulong)node_index);
  _Var1 = p_Stack_50->node_type;
  if (_Var1 == k_nodetype_group) {
    pp_Var7 = _vox_array<const__vox_scene_node__*>::peek_back
                        ((_vox_array<const__vox_scene_node__*> *)nodes_local,0);
    group.transform_anim._8_8_ = *pp_Var7;
    if (((_vox_scene_node_ *)group.transform_anim._8_8_)->node_type != k_nodetype_transform) {
      __assert_fail("(last_transform->node_type == k_nodetype_transform) && (\"expected transform node prior to group node\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                    ,0x482,
                    "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                   );
    }
    sVar5 = _vox_array<ogt_vox_group>::size(groups);
    group.transform.m32 = (float)group_index;
    memcpy(&group,(void *)(group.transform_anim._8_8_ + 0x108),0x40);
    group.parent_group_index._0_1_ = *(byte *)(group.transform_anim._8_8_ + 0x150) & 1;
    group.transform.m33 = *(float *)(group.transform_anim._8_8_ + 0x14c);
    transform_last_name = (char *)0x0;
    str = (char *)(group.transform_anim._8_8_ + 8);
    if ((str != (char *)0x0) && (*str != '\0')) {
      transform_last_name = (char *)_vox_suballoc_array::push_string(misc_data,str);
    }
    clear_anim_transform((ogt_vox_anim_transform *)&group.hidden);
    if ((node._7_1_ & 1) != 0) {
      group.transform_anim.keyframes._0_4_ = *(undefined4 *)(group.transform_anim._8_8_ + 0x154);
      group._80_8_ = *(undefined8 *)(group.transform_anim._8_8_ + 0x158);
      group.transform_anim.keyframes._4_1_ = *(byte *)(group.transform_anim._8_8_ + 0x160) & 1;
    }
    _vox_array<ogt_vox_group>::push_back(groups,(ogt_vox_group *)&transform_last_name);
    _vox_array<const__vox_scene_node__*>::push_back
              ((_vox_array<const__vox_scene_node__*> *)nodes_local,&stack0xffffffffffffffb0);
    puVar4 = _vox_array<unsigned_int>::operator[]
                       ((_vox_array<unsigned_int> *)model_ptrs_local,
                        (ulong)(p_Stack_50->u).group.first_child_node_id_index);
    for (last_transform_1._4_4_ = 0; last_transform_1._4_4_ < (p_Stack_50->u).group.num_child_nodes;
        last_transform_1._4_4_ = last_transform_1._4_4_ + 1) {
      generate_instances_for_node
                ((_vox_array<const__vox_scene_node__*> *)nodes_local,p_Stack_20,
                 puVar4[last_transform_1._4_4_],(_vox_array<unsigned_int> *)model_ptrs_local,
                 (_vox_array<ogt_vox_model_*> *)instances_local,p_Stack_40,misc_data,groups,
                 (uint32_t)sVar5,(bool)(node._7_1_ & 1));
    }
    _vox_array<const__vox_scene_node__*>::pop_back
              ((_vox_array<const__vox_scene_node__*> *)nodes_local);
  }
  else if (_Var1 == k_nodetype_transform) {
    _vox_array<const__vox_scene_node__*>::push_back
              ((_vox_array<const__vox_scene_node__*> *)nodes_local,&stack0xffffffffffffffb0);
    generate_instances_for_node
              ((_vox_array<const__vox_scene_node__*> *)nodes_local,p_Stack_20,
               (p_Stack_50->u).transform.child_node_id,(_vox_array<unsigned_int> *)model_ptrs_local,
               (_vox_array<ogt_vox_model_*> *)instances_local,p_Stack_40,misc_data,groups,
               group_index,(bool)(node._7_1_ & 1));
    _vox_array<const__vox_scene_node__*>::pop_back
              ((_vox_array<const__vox_scene_node__*> *)nodes_local);
  }
  else {
    if (_Var1 != k_nodetype_shape) {
      __assert_fail("(0) && (\"unhandled node type\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                    ,0x4cc,
                    "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                   );
    }
    uVar2 = (p_Stack_50->u).group.first_child_node_id_index;
    sVar5 = _vox_array<ogt_vox_model_*>::size((_vox_array<ogt_vox_model_*> *)instances_local);
    if (sVar5 <= uVar2) {
      __assert_fail("(node->u.shape.model_id < model_ptrs.size()) && (\"unexpected model id for shape node\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                    ,0x4a2,
                    "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                   );
    }
    uVar2 = (p_Stack_50->u).group.first_child_node_id_index;
    sVar5 = _vox_array<ogt_vox_model_*>::size((_vox_array<ogt_vox_model_*> *)instances_local);
    if ((uVar2 < sVar5) &&
       (ppoVar6 = _vox_array<ogt_vox_model_*>::operator[]
                            ((_vox_array<ogt_vox_model_*> *)instances_local,
                             (ulong)(p_Stack_50->u).group.first_child_node_id_index),
       *ppoVar6 != (ogt_vox_model *)0x0)) {
      pp_Var7 = _vox_array<const__vox_scene_node__*>::peek_back
                          ((_vox_array<const__vox_scene_node__*> *)nodes_local,0);
      p_Var3 = *pp_Var7;
      pp_Var7 = _vox_array<const__vox_scene_node__*>::peek_back
                          ((_vox_array<const__vox_scene_node__*> *)nodes_local,1);
      new_instance.model_anim._8_8_ = *pp_Var7;
      if (p_Var3->node_type != k_nodetype_transform) {
        __assert_fail("(last_transform->node_type == k_nodetype_transform) && (\"parent node type to a shape node must be a transform node\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                      ,0x4a9,
                      "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                     );
      }
      if (((_vox_scene_node_ *)new_instance.model_anim._8_8_)->node_type != k_nodetype_group) {
        __assert_fail("(last_group->node_type == k_nodetype_group) && (\"grandparent node type to a shape node must be a group node\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                      ,0x4aa,
                      "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                     );
      }
      new_instance.transform.m32 = (float)(p_Stack_50->u).group.first_child_node_id_index;
      memcpy(&new_instance,(void *)((long)&p_Var3->u + 0x100),0x40);
      new_instance.transform.m33 = *(float *)((long)&p_Var3->u + 0x144);
      new_instance.model_index = group_index;
      new_instance.layer_index._0_1_ = (p_Var3->u).transform.hidden & 1;
      transform_last_name_1 = (char *)0x0;
      str_00 = &p_Var3->u;
      if ((str_00 != (anon_union_352_3_5477816a_for_u *)0x0) &&
         ((str_00->transform).name[0] != '\0')) {
        transform_last_name_1 = (char *)_vox_suballoc_array::push_string(misc_data,(char *)str_00);
      }
      clear_anim_transform((ogt_vox_anim_transform *)&new_instance.group_index);
      clear_anim_model((ogt_vox_anim_model *)&new_instance.transform_anim.num_keyframes);
      if ((node._7_1_ & 1) != 0) {
        new_instance.model_anim.keyframes._0_4_ = (p_Stack_50->u).group.num_child_nodes;
        new_instance.transform_anim._8_8_ = (p_Stack_50->u).shape.keyframe_offset;
        new_instance.model_anim.keyframes._4_1_ = (p_Stack_50->u).transform.name[0x10] & 1;
        new_instance.transform_anim.keyframes._0_4_ = (p_Var3->u).transform.num_keyframes;
        new_instance._80_8_ = (p_Var3->u).transform.keyframe_offset;
        new_instance.transform_anim.keyframes._4_1_ = (p_Var3->u).transform.loop & 1;
      }
      _vox_array<ogt_vox_instance>::push_back(p_Stack_40,(ogt_vox_instance *)&transform_last_name_1)
      ;
    }
  }
  return;
}

Assistant:

static void generate_instances_for_node(
        _vox_array<const _vox_scene_node_*> & stack, const _vox_array<_vox_scene_node_> & nodes, uint32_t node_index, const _vox_array<uint32_t> & child_id_array, const _vox_array<ogt_vox_model*> & model_ptrs,
        _vox_array<ogt_vox_instance> & instances, _vox_suballoc_array & misc_data, _vox_array<ogt_vox_group>& groups, uint32_t group_index, bool generate_keyframes)
    {
        const _vox_scene_node_* node = &nodes[node_index];
        switch (node->node_type)
        {
            case k_nodetype_transform:
            {
                stack.push_back(node);
                generate_instances_for_node(stack, nodes, node->u.transform.child_node_id, child_id_array, model_ptrs, instances, misc_data, groups, group_index,  generate_keyframes);
                stack.pop_back();
                break;
            }
            case k_nodetype_group:
            {
                // create a new group only if we're generating groups.
                uint32_t next_group_index = 0;
                {
                    const _vox_scene_node_* last_transform = stack.peek_back(0);
                    ogt_assert(last_transform->node_type == k_nodetype_transform, "expected transform node prior to group node");

                    next_group_index = (uint32_t)groups.size();
                    ogt_vox_group group;
                    group.parent_group_index = group_index;
                    group.transform          = last_transform->u.transform.transform;
                    group.hidden             = last_transform->u.transform.hidden;
                    group.layer_index        = last_transform->u.transform.layer_id;
                    group.name               = 0;
                    const char* transform_last_name = last_transform->u.transform.name;
                    if (transform_last_name && transform_last_name[0]) {
                        group.name = (const char*)misc_data.push_string(transform_last_name);
                    }
                    clear_anim_transform(&group.transform_anim);
                    if (generate_keyframes) {
                        group.transform_anim.num_keyframes = last_transform->u.transform.num_keyframes;
                        group.transform_anim.keyframes     = (const ogt_vox_keyframe_transform*)(last_transform->u.transform.keyframe_offset);
                        group.transform_anim.loop          = last_transform->u.transform.loop;
                    }
                    groups.push_back(group);
                }

                stack.push_back(node);
                const uint32_t* child_node_ids = (const uint32_t*)& child_id_array[node->u.group.first_child_node_id_index];
                for (uint32_t i = 0; i < node->u.group.num_child_nodes; i++) {
                    generate_instances_for_node(stack, nodes, child_node_ids[i], child_id_array, model_ptrs, instances, misc_data, groups, next_group_index, generate_keyframes);
                }
                stack.pop_back();
                break;
            }
            case k_nodetype_shape:
            {
                ogt_assert(node->u.shape.model_id < model_ptrs.size(), "unexpected model id for shape node");
                if (node->u.shape.model_id < model_ptrs.size() &&    // model ID is valid
                    model_ptrs[node->u.shape.model_id] != NULL )     // model is non-NULL.
                {
                    const _vox_scene_node_* last_transform = stack.peek_back(0);
                    const _vox_scene_node_* last_group     = stack.peek_back(1);
                    (void)last_group;
                    ogt_assert(last_transform->node_type == k_nodetype_transform, "parent node type to a shape node must be a transform node");
                    ogt_assert(last_group->node_type == k_nodetype_group, "grandparent node type to a shape node must be a group node");

                    ogt_vox_instance new_instance;
                    new_instance.model_index = node->u.shape.model_id;
                    new_instance.transform   = last_transform->u.transform.transform;
                    new_instance.layer_index = last_transform->u.transform.layer_id;
                    new_instance.group_index = group_index;
                    new_instance.hidden      = last_transform->u.transform.hidden;
                    // if we got a transform name, allocate space in misc_data for it and keep track of the index
                    // within string data. This will be patched to a real pointer at the very end.
                    new_instance.name = 0;
                    const char* transform_last_name = last_transform->u.transform.name;
                    if (transform_last_name && transform_last_name[0]) {
                        new_instance.name = (const char*)misc_data.push_string(transform_last_name);
                    }
                    // generate keyframes if necessary.
                    clear_anim_transform(&new_instance.transform_anim);
                    clear_anim_model(&new_instance.model_anim);
                    if (generate_keyframes) {
                        new_instance.model_anim.num_keyframes     = node->u.shape.num_keyframes;
                        new_instance.model_anim.keyframes         = (const ogt_vox_keyframe_model*)(node->u.shape.keyframe_offset);
                        new_instance.model_anim.loop              = node->u.shape.loop;
                        new_instance.transform_anim.num_keyframes = last_transform->u.transform.num_keyframes;
                        new_instance.transform_anim.keyframes     = (const ogt_vox_keyframe_transform*)(last_transform->u.transform.keyframe_offset);
                        new_instance.transform_anim.loop          = last_transform->u.transform.loop;
                    }

                    // create the instance
                    instances.push_back(new_instance);
                }
                break;
            }
            default:
            {
                ogt_assert(0, "unhandled node type");
            }
        }
    }